

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool operator==(CService *a,CService *b)

{
  long lVar1;
  bool bVar2;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  CNetAddr *in_stack_ffffffffffffff88;
  CNetAddr *in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff99;
  undefined1 in_stack_ffffffffffffff9a;
  byte bVar3;
  undefined1 in_stack_ffffffffffffff9b;
  undefined4 in_stack_ffffffffffffff9c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::CNetAddr((CNetAddr *)
                     CONCAT44(in_stack_ffffffffffffff9c,
                              CONCAT13(in_stack_ffffffffffffff9b,
                                       CONCAT12(in_stack_ffffffffffffff9a,
                                                CONCAT11(in_stack_ffffffffffffff99,
                                                         in_stack_ffffffffffffff98)))),
                     in_stack_ffffffffffffff90);
  CNetAddr::CNetAddr((CNetAddr *)
                     CONCAT44(in_stack_ffffffffffffff9c,
                              CONCAT13(in_stack_ffffffffffffff9b,
                                       CONCAT12(in_stack_ffffffffffffff9a,
                                                CONCAT11(in_stack_ffffffffffffff99,
                                                         in_stack_ffffffffffffff98)))),
                     in_stack_ffffffffffffff90);
  bVar2 = operator==((CNetAddr *)
                     CONCAT44(in_stack_ffffffffffffff9c,
                              CONCAT13(in_stack_ffffffffffffff9b,
                                       CONCAT12(in_stack_ffffffffffffff9a,
                                                CONCAT11(in_stack_ffffffffffffff99,
                                                         in_stack_ffffffffffffff98)))),
                     in_stack_ffffffffffffff90);
  bVar3 = false;
  if (bVar2) {
    bVar3 = *(short *)(in_RDI + 0x20) == *(short *)(in_RSI + 0x20);
  }
  CNetAddr::~CNetAddr(in_stack_ffffffffffffff88);
  CNetAddr::~CNetAddr(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool operator==(const CService& a, const CService& b)
{
    return static_cast<CNetAddr>(a) == static_cast<CNetAddr>(b) && a.port == b.port;
}